

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShaded<float>
               (char *label_id,float *xs,float *ys,int count,double y_ref,int offset,int stride)

{
  bool bVar1;
  bool bVar2;
  GetterXsYs<float> local_70;
  GetterXsYRef<float> local_50;
  
  bVar1 = -INFINITY < y_ref;
  if (!bVar1) {
    GetPlotLimits((ImPlotLimits *)&local_70,-1);
    y_ref = (double)CONCAT44(local_70.Offset,local_70.Count);
  }
  bVar2 = y_ref < INFINITY;
  if (!bVar2) {
    GetPlotLimits((ImPlotLimits *)&local_70,-1);
    y_ref = (double)CONCAT44(local_70._28_4_,local_70.Stride);
  }
  if (count == 0) {
    local_70.Offset = 0;
  }
  else {
    local_70.Offset = (offset % count + count) % count;
  }
  local_70.Xs = xs;
  local_70.Ys = ys;
  local_70.Count = count;
  local_70.Stride = stride;
  local_50.Xs = xs;
  local_50.YRef = y_ref;
  local_50.Count = count;
  local_50.Offset = local_70.Offset;
  local_50.Stride = stride;
  PlotShadedEx<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>>
            (label_id,&local_70,&local_50,bVar2 && bVar1);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    bool fit2 = true;
    if (y_ref == -HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Min;
    }
    if (y_ref == HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Max;
    }
    GetterXsYs<T> getter1(xs, ys, count, offset, stride);
    GetterXsYRef<T> getter2(xs, y_ref, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2, fit2);
}